

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall Heap<int>::heapify(Heap<int> *this,int i)

{
  ulong uVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  _Elt_pointer piVar5;
  int iVar6;
  int index;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  int local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_8c = i;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,&local_8c);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = i;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      piVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      iVar6 = piVar5[-1];
      uVar1 = (long)iVar6 * 2 + 1;
      piVar3 = (this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_90 = iVar6;
      if ((uVar1 < (ulong)((long)(this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar3 >> 2) >> 1) &&
         (bVar4 = (*this->compare)(piVar3[uVar1],piVar3[iVar6]), bVar4)) {
        local_90 = (int)uVar1;
      }
      iVar6 = iVar6 * 2 + 2;
      piVar3 = (this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((ulong)(long)iVar6 <
           (ulong)((long)(this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar3 >> 2) >> 1) &&
         (bVar4 = (*this->compare)(piVar3[iVar6],piVar3[local_90]), bVar4)) {
        local_90 = iVar6;
      }
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        iVar6 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x7f];
        if (local_90 != iVar6) {
          piVar3 = (this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = piVar3[iVar6];
          piVar3[iVar6] = piVar3[local_90];
          piVar3[local_90] = iVar2;
          operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          goto LAB_0010e070;
        }
      }
      else {
        iVar6 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        if (local_90 != iVar6) {
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          piVar3 = (this->arr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar2 = piVar3[iVar6];
          piVar3[iVar6] = piVar3[local_90];
          piVar3[local_90] = iVar2;
LAB_0010e070:
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_88,&local_90);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void heapify(int i) {
        std::stack<int> s;
        s.push(i);

        while (!s.empty()) {
            int index = s.top();

            int left = 2 * index + 1;
            int right = 2 * index + 2;

            if (left < arr.size() / 2 && compare(arr[left], arr[index])) {
                index = left;
            }

            if (right < arr.size() / 2 && compare(arr[right], arr[index])) {
                index = right;
            }

            if (index != s.top()) {
                Swap(arr[s.top()], arr[index]);
                s.pop();

                s.push(index);
            }
        }
    }